

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
::EqualElement<char[17]>::operator()
          (EqualElement<char[17]> *this,basic_string_view<char,_std::char_traits<char>_> *lhs,
          piecewise_construct_t *param_2,
          tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *param_3,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *param_4)

{
  size_t __n;
  char *__s1;
  char *__s;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_type __rlen;
  
  __n = lhs->_M_len;
  __s1 = lhs->_M_str;
  __s = *(char **)this;
  sVar3 = strlen(__s);
  if (__n == sVar3) {
    if (__n != 0) {
      iVar2 = bcmp(__s1,__s,__n);
      if (iVar2 != 0) goto LAB_002aeeed;
    }
    bVar1 = true;
  }
  else {
LAB_002aeeed:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator()(const K2& lhs, Args&&...) const {
      return eq(lhs, rhs);
    }